

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ProcessLineDefs(UDMFParser *this)

{
  double *pdVar1;
  uint32_t *puVar2;
  double dVar3;
  vertex_t *pvVar4;
  vertex_t *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  int iVar10;
  line_t_conflict *plVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint32_t *puVar16;
  uint32_t *puVar17;
  uint uVar18;
  short *alpha;
  bool bVar19;
  byte bVar20;
  int local_50;
  short tempalpha [2];
  
  bVar20 = 0;
  local_50 = 0;
  uVar18 = 0;
  if ((this->ParsedLines).Count != 0) {
    local_50 = 0;
    uVar12 = 0;
    iVar10 = 0;
    do {
      uVar18 = (uint)uVar12;
      plVar11 = (this->ParsedLines).Array;
      pvVar4 = plVar11[uVar12].v1;
      pvVar5 = plVar11[uVar12].v2;
      if (((long)pvVar4 < (long)numvertexes) &&
         (-1 < (long)((ulong)pvVar4 | (ulong)pvVar5) && (long)pvVar5 < (long)numvertexes)) {
        if (pvVar4 != pvVar5) {
          dVar3 = vertexes[(long)pvVar4].p.X;
          if ((((dVar3 != vertexes[(long)pvVar5].p.X) ||
               (NAN(dVar3) || NAN(vertexes[(long)pvVar5].p.X))) ||
              (dVar3 = vertexes[(long)pvVar4].p.Y, pdVar1 = &vertexes[(long)pvVar5].p.Y,
              dVar3 != *pdVar1)) || (NAN(dVar3) || NAN(*pdVar1))) {
            plVar11 = plVar11 + uVar12;
            plVar11->v1 = vertexes + (long)pvVar4;
            plVar11->v2 = vertexes + (long)pvVar5;
            local_50 = ((local_50 - (uint)(plVar11->sidedef[0] == (side_t *)0x0)) + 2) -
                       (uint)(plVar11->sidedef[1] == (side_t *)0x0);
            TArray<int,_int>::Grow(&linemap,1);
            linemap.Array[linemap.Count] = uVar18 + iVar10;
            linemap.Count = linemap.Count + 1;
            uVar12 = (ulong)(uVar18 + 1);
            goto LAB_00463843;
          }
        }
        Printf("Removing 0-length line %d\n",(ulong)(uVar18 + iVar10));
        uVar9 = (this->ParsedLines).Count;
        if (uVar18 < uVar9) {
          uVar9 = uVar9 - 1;
          (this->ParsedLines).Count = uVar9;
          if (uVar18 <= uVar9 && uVar9 - uVar18 != 0) {
            plVar11 = (this->ParsedLines).Array;
            memmove(plVar11 + uVar12,plVar11 + (uVar18 + 1),(ulong)(uVar9 - uVar18) * 0x98);
          }
        }
        ForceNodeBuild = true;
        iVar10 = iVar10 + 1;
      }
      else {
        I_Error("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.",
                (ulong)(uVar18 + iVar10));
      }
LAB_00463843:
      uVar18 = (this->ParsedLines).Count;
    } while ((uint)uVar12 < uVar18);
  }
  numsides = local_50;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(int)uVar18;
  uVar12 = SUB168(auVar6 * ZEXT816(0x98),0);
  if (SUB168(auVar6 * ZEXT816(0x98),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  numlines = uVar18;
  lines = (line_t_conflict *)operator_new__(uVar12);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)local_50;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0xc0),8) == 0) {
    uVar12 = SUB168(auVar7 * ZEXT816(0xc0),0);
  }
  sides = (side_t *)operator_new__(uVar12);
  if ((int)uVar18 < 1) {
    iVar15 = 0;
    iVar10 = local_50;
  }
  else {
    lVar14 = 0;
    iVar15 = 0;
    do {
      tempalpha[0] = -0x8000;
      tempalpha[1] = -0x8000;
      plVar11 = (this->ParsedLines).Array + lVar14;
      pvVar4 = plVar11->v2;
      puVar2 = &lines[lVar14].flags;
      ((line_t_conflict *)(puVar2 + -8))->v1 = plVar11->v1;
      *(vertex_t **)(puVar2 + -6) = pvVar4;
      dVar3 = (plVar11->delta).Y;
      ((DVector2 *)(puVar2 + -4))->X = (plVar11->delta).X;
      *(double *)(puVar2 + -2) = dVar3;
      puVar16 = &plVar11->flags;
      puVar17 = puVar2;
      for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined8 *)puVar17 = *(undefined8 *)puVar16;
        puVar16 = puVar16 + ((ulong)bVar20 * -2 + 1) * 2;
        puVar17 = puVar17 + (ulong)bVar20 * -4 + 2;
      }
      puVar2[0x1c] = plVar11->portalindex;
      alpha = tempalpha;
      lVar13 = 0;
      bVar8 = true;
      do {
        bVar19 = bVar8;
        if (lines[lVar14].sidedef[lVar13] != (side_t *)0x0) {
          iVar10 = (int)lines[lVar14].sidedef[lVar13];
          if (local_50 < iVar10) {
            lines[lVar14].sidedef[lVar13] = (side_t *)0x0;
          }
          else {
            iVar10 = iVar10 + -1;
            memcpy(sides + iVar15,(this->ParsedSides).Array + iVar10,0xbc);
            sides[iVar15].linedef = lines + lVar14;
            sides[iVar15].sector = sectors + (long)sides[iVar15].sector;
            lines[lVar14].sidedef[lVar13] = sides + iVar15;
            P_ProcessSideTextures
                      ((bool)(this->isExtended ^ 1),sides + iVar15,sides[iVar15].sector,
                       (this->ParsedSideTextures).Array + iVar10,lines[lVar14].special,
                       lines[lVar14].args[0],alpha,this->missingTex);
            iVar15 = iVar15 + 1;
          }
        }
        alpha = tempalpha + 1;
        lVar13 = 1;
        bVar8 = false;
      } while (bVar19);
      P_AdjustLine(lines + lVar14);
      P_FinishLoadingLineDef(lines + lVar14,(int)tempalpha[0]);
      lVar14 = lVar14 + 1;
      iVar10 = numsides;
    } while (lVar14 < numlines);
  }
  if (iVar10 < iVar15) {
    __assert_fail("side <= numsides",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_udmf.cpp"
                  ,0x720,"void UDMFParser::ProcessLineDefs()");
  }
  if (iVar15 < iVar10) {
    Printf("Map had %d invalid side references\n");
    numsides = iVar15;
  }
  return;
}

Assistant:

void ProcessLineDefs()
	{
		int sidecount = 0;
		for(unsigned i = 0, skipped = 0; i < ParsedLines.Size();)
		{
			// Relocate the vertices
			intptr_t v1i = intptr_t(ParsedLines[i].v1);
			intptr_t v2i = intptr_t(ParsedLines[i].v2);

			if (v1i >= numvertexes || v2i >= numvertexes || v1i < 0 || v2i < 0)
			{
				I_Error ("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.", i+skipped, v1i, v2i, numvertexes);
			}
			else if (v1i == v2i ||
				(vertexes[v1i].fX() == vertexes[v2i].fX() && vertexes[v1i].fY() == vertexes[v2i].fY()))
			{
				Printf ("Removing 0-length line %d\n", i+skipped);
				ParsedLines.Delete(i);
				ForceNodeBuild = true;
				skipped++;
			}
			else
			{
				ParsedLines[i].v1 = &vertexes[v1i];
				ParsedLines[i].v2 = &vertexes[v2i];

				if (ParsedLines[i].sidedef[0] != NULL)
					sidecount++;
				if (ParsedLines[i].sidedef[1] != NULL)
					sidecount++;
				linemap.Push(i+skipped);
				i++;
			}
		}
		numlines = ParsedLines.Size();
		numsides = sidecount;
		lines = new line_t[numlines];
		sides = new side_t[numsides];
		int line, side;

		for(line = 0, side = 0; line < numlines; line++)
		{
			short tempalpha[2] = { SHRT_MIN, SHRT_MIN };

			lines[line] = ParsedLines[line];

			for(int sd = 0; sd < 2; sd++)
			{
				if (lines[line].sidedef[sd] != NULL)
				{
					int mapside = int(intptr_t(lines[line].sidedef[sd]))-1;
					if (mapside < sidecount)
					{
						sides[side] = ParsedSides[mapside];
						sides[side].linedef = &lines[line];
						sides[side].sector = &sectors[intptr_t(sides[side].sector)];
						lines[line].sidedef[sd] = &sides[side];

						P_ProcessSideTextures(!isExtended, &sides[side], sides[side].sector, &ParsedSideTextures[mapside],
							lines[line].special, lines[line].args[0], &tempalpha[sd], missingTex);

						side++;
					}
					else
					{
						lines[line].sidedef[sd] = NULL;
					}
				}
			}

			P_AdjustLine(&lines[line]);
			P_FinishLoadingLineDef(&lines[line], tempalpha[0]);
		}
		assert(side <= numsides);
		if (side < numsides)
		{
			Printf("Map had %d invalid side references\n", numsides - side);
			numsides = side;
		}
	}